

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O1

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar2;
  uv_tcp_t *puVar3;
  uv_stream_t *puVar4;
  uv_loop_t *puVar5;
  sockaddr_in addr;
  uv_tcp_t conn;
  uv_write_t write_req;
  uv_connect_t connect_req;
  uv_buf_t local_240;
  sockaddr_in local_230;
  uv_tcp_t local_220;
  undefined1 local_128 [288];
  
  puVar5 = (uv_loop_t *)0x1b4e3a;
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_230);
  if (iVar1 == 0) {
    local_240 = uv_buf_init("TEST",4);
    puVar5 = uv_default_loop();
    puVar3 = &local_220;
    iVar1 = uv_tcp_init(puVar5,puVar3);
    iVar2 = (int)puVar3;
    if (iVar1 != 0) goto LAB_0017cadf;
    puVar5 = (uv_loop_t *)local_128;
    puVar4 = (uv_stream_t *)&local_220;
    iVar1 = uv_write((uv_write_t *)puVar5,puVar4,&local_240,1,write_cb);
    iVar2 = (int)puVar4;
    if (iVar1 != -9) goto LAB_0017cae4;
    puVar5 = (uv_loop_t *)(local_128 + 0xc0);
    puVar3 = &local_220;
    iVar1 = uv_tcp_connect((uv_connect_t *)puVar5,puVar3,(sockaddr *)&local_230,connect_cb);
    iVar2 = (int)puVar3;
    if (iVar1 != 0) goto LAB_0017cae9;
    puVar5 = (uv_loop_t *)local_128;
    puVar4 = (uv_stream_t *)&local_220;
    iVar1 = uv_write((uv_write_t *)puVar5,puVar4,&local_240,1,write_cb);
    iVar2 = (int)puVar4;
    if (iVar1 != 0) goto LAB_0017caee;
    puVar5 = uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017caf3;
    if (connect_cb_called != 1) goto LAB_0017caf8;
    if (write_cb_called != 1) goto LAB_0017cafd;
    if (close_cb_called == 1) {
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      iVar2 = 0;
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017cb07;
    }
  }
  else {
    run_test_tcp_connect_error_after_write_cold_1();
LAB_0017cadf:
    run_test_tcp_connect_error_after_write_cold_2();
LAB_0017cae4:
    run_test_tcp_connect_error_after_write_cold_3();
LAB_0017cae9:
    run_test_tcp_connect_error_after_write_cold_4();
LAB_0017caee:
    run_test_tcp_connect_error_after_write_cold_5();
LAB_0017caf3:
    run_test_tcp_connect_error_after_write_cold_6();
LAB_0017caf8:
    run_test_tcp_connect_error_after_write_cold_7();
LAB_0017cafd:
    run_test_tcp_connect_error_after_write_cold_8();
  }
  run_test_tcp_connect_error_after_write_cold_9();
LAB_0017cb07:
  run_test_tcp_connect_error_after_write_cold_10();
  if (iVar2 < 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  write_cb_cold_1();
  if (iVar2 < 0) {
    connect_cb_called = connect_cb_called + 1;
    uv_close((uv_handle_t *)puVar5->pending_queue[0],close_cb);
    return extraout_EAX_00;
  }
  connect_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

#ifdef _WIN32
  fprintf(stderr, "This test is disabled on Windows for now.\n");
  fprintf(stderr, "See https://github.com/joyent/libuv/issues/444\n");
  return 0; /* windows slackers... */
#endif

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}